

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O0

gdImagePtr gdImageCreateFromGd2Part(FILE *inFile,int srcx,int srcy,int w,int h)

{
  gdIOCtx *in_00;
  gdIOCtx *in;
  gdImagePtr im;
  int h_local;
  int w_local;
  int srcy_local;
  int srcx_local;
  FILE *inFile_local;
  
  in_00 = gdNewFileCtx(inFile);
  if (in_00 == (gdIOCtx *)0x0) {
    inFile_local = (FILE *)0x0;
  }
  else {
    inFile_local = (FILE *)gdImageCreateFromGd2PartCtx(in_00,srcx,srcy,w,h);
    (*in_00->gd_free)(in_00);
  }
  return (gdImagePtr)inFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Part (FILE * inFile, int srcx, int srcy, int w, int h)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewFileCtx (inFile);

	if (in == NULL) return NULL;
	im = gdImageCreateFromGd2PartCtx (in, srcx, srcy, w, h);

	in->gd_free (in);

	return im;
}